

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ConsumeSignedInteger(Parser *this,int *output,char *error)

{
  bool bVar1;
  bool bVar2;
  uint64 value;
  uint64 local_28;
  
  bVar1 = TryConsume(this,"-");
  local_28 = 0;
  bVar2 = ConsumeInteger64(this,(ulong)bVar1 + 0x7fffffff,&local_28,error);
  if (bVar2) {
    if (bVar1) {
      local_28 = -local_28;
    }
    *output = (int)local_28;
  }
  return bVar2;
}

Assistant:

bool Parser::ConsumeSignedInteger(int* output, const char* error) {
  bool is_negative = false;
  uint64 max_value = kint32max;
  if (TryConsume("-")) {
    is_negative = true;
    max_value += 1;
  }
  uint64 value = 0;
  DO(ConsumeInteger64(max_value, &value, error));
  if (is_negative) value *= -1;
  *output = value;
  return true;
}